

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

void Acb_Ntk4DumpWeights(char *pFileNameIn,Vec_Ptr_t *vObjNames,char *pFileName)

{
  int iVar1;
  Acb_ObjType_t AVar2;
  Vec_Int_t *p;
  Acb_Ntk_t *p_00;
  char *__s2;
  char *__s1;
  Acb_Ntk_t *pNtkF;
  Vec_Int_t *vObjs;
  int iObj;
  int i;
  char *pName;
  char *pFileName_local;
  Vec_Ptr_t *vObjNames_local;
  char *pFileNameIn_local;
  
  iVar1 = Vec_PtrSize(vObjNames);
  p = Vec_IntAlloc(iVar1);
  p_00 = Acb_VerilogSimpleRead(pFileNameIn,(char *)0x0);
  Acb_NtkCreateFanout(p_00);
  for (vObjs._4_4_ = 0; iVar1 = Vec_PtrSize(vObjNames), vObjs._4_4_ < iVar1;
      vObjs._4_4_ = vObjs._4_4_ + 1) {
    __s2 = (char *)Vec_PtrEntry(vObjNames,vObjs._4_4_);
    for (vObjs._0_4_ = 1; iVar1 = Vec_StrSize(&p_00->vObjType), (int)vObjs < iVar1;
        vObjs._0_4_ = (int)vObjs + 1) {
      AVar2 = Acb_ObjType(p_00,(int)vObjs);
      if (AVar2 != ABC_OPER_NONE) {
        __s1 = Acb_ObjNameStr(p_00,(int)vObjs);
        iVar1 = strcmp(__s1,__s2);
        if (iVar1 == 0) {
          Vec_IntPush(p,(int)vObjs);
        }
      }
    }
  }
  Acb_Ntk4DumpWeightsInt(p_00,p,pFileName);
  Acb_ManFree(p_00->pDesign);
  Vec_IntFree(p);
  return;
}

Assistant:

void Acb_Ntk4DumpWeights( char * pFileNameIn, Vec_Ptr_t * vObjNames, char * pFileName )
{
    char * pName; int i, iObj;
    Vec_Int_t * vObjs = Vec_IntAlloc( Vec_PtrSize(vObjNames) );
    Acb_Ntk_t * pNtkF = Acb_VerilogSimpleRead( pFileNameIn, NULL );
    Acb_NtkCreateFanout( pNtkF );
    Vec_PtrForEachEntry( char *, vObjNames, pName, i )
    {
        Acb_NtkForEachObj( pNtkF, iObj )
            if ( !strcmp(Acb_ObjNameStr(pNtkF, iObj), pName) )
                Vec_IntPush( vObjs, iObj );
    }
    Acb_Ntk4DumpWeightsInt( pNtkF, vObjs, pFileName );
    Acb_ManFree( pNtkF->pDesign );
    Vec_IntFree( vObjs );
}